

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  StringPiece y;
  string *psVar1;
  bool bVar2;
  LogMessage *pLVar3;
  pair<std::__detail::_Node_iterator<google::protobuf::Symbol,_true,_true>,_bool> pVar4;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> local_c8;
  LogFinisher local_ad [20];
  byte local_99;
  LogMessage local_98;
  pair<const_void_*,_google::protobuf::stringpiece_internal::StringPiece> local_60;
  char *local_48;
  size_type local_40;
  StringPiece local_38;
  string *local_28;
  string *name_local;
  void *parent_local;
  FileDescriptorTables *this_local;
  Symbol symbol_local;
  
  local_28 = name;
  name_local = (string *)parent;
  parent_local = this;
  this_local = (FileDescriptorTables *)symbol.ptr_;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_38,name);
  Symbol::parent_name_key(&local_60,(Symbol *)&this_local);
  local_48 = local_60.second.ptr_;
  local_40 = local_60.second.length_;
  y.length_ = local_60.second.length_;
  y.ptr_ = local_60.second.ptr_;
  bVar2 = stringpiece_internal::operator==(local_38,y);
  local_99 = 0;
  if (!bVar2) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x685);
    local_99 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: (name) == (symbol.parent_name_key().second): ");
    internal::LogFinisher::operator=(local_ad,pLVar3);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_98);
  }
  psVar1 = name_local;
  Symbol::parent_name_key(&local_c8,(Symbol *)&this_local);
  local_101 = 0;
  if (psVar1 != (string *)local_c8.first) {
    internal::LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x686);
    local_101 = 1;
    pLVar3 = internal::LogMessage::operator<<
                       (&local_100,"CHECK failed: (parent) == (symbol.parent_name_key().first): ");
    internal::LogFinisher::operator=(&local_102,pLVar3);
  }
  if ((local_101 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_100);
  }
  pVar4 = std::
          unordered_set<google::protobuf::Symbol,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::insert(&this->symbols_by_parent_,(value_type *)&this_local);
  return (bool)(pVar4.second & 1);
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               const std::string& name,
                                               Symbol symbol) {
  GOOGLE_DCHECK_EQ(name, symbol.parent_name_key().second);
  GOOGLE_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}